

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

bool __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::CheckEnumForBuffer
          (BlendMaskStateMachine *this,int idx,GLenum e,GLenum s)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_1b8;
  GLboolean local_31;
  GLenum GStack_30;
  GLboolean b;
  GLint64 li;
  GLint i;
  GLenum s_local;
  GLenum e_local;
  int idx_local;
  BlendMaskStateMachine *this_local;
  
  li._4_4_ = s;
  i = e;
  s_local = idx;
  _e_local = this;
  (*this->gl->getIntegeri_v)(e,idx,(GLint *)&li);
  (*this->gl->getInteger64i_v)(i,s_local,(GLint64 *)&GStack_30);
  (*this->gl->getBooleani_v)(i,s_local,&local_31);
  if ((((GLenum)li == li._4_4_) && (GStack_30 == li._4_4_)) && ((bool)local_31 == (li._4_4_ != 0)))
  {
    this_local._7_1_ = true;
  }
  else {
    tcu::TestLog::operator<<(&local_1b8,this->testLog,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [11])"State for ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)&i);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [13])" in buffer #");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)&s_local);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [19])0x2b36080);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)((long)&li + 4));
    pMVar1 = tcu::MessageBuilder::operator<<
                       (pMVar1,(char (*) [34])" but found the following values:\n");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [6])0x2b020cb);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)&li);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b9e07b);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [8])"int64: ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(long *)&GStack_30);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b9e07b);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [7])0x2b3cb18);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_31);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DrawBuffersIndexedBase::BlendMaskStateMachine::CheckEnumForBuffer(int idx, glw::GLenum e, glw::GLenum s)
{
	glw::GLint	 i;
	glw::GLint64   li;
	glw::GLboolean b;

	gl.getIntegeri_v(e, idx, &i);
	gl.getInteger64i_v(e, idx, &li);
	gl.getBooleani_v(e, idx, &b);
	if ((static_cast<glw::GLenum>(i) != s) || (static_cast<glw::GLenum>(li) != s) || (b != (s ? GL_TRUE : GL_FALSE)))
	{
		testLog << tcu::TestLog::Message << "State for " << e << " in buffer #" << idx << " should be set to " << s
				<< " but found the following values:\n"
				<< "int: " << i << "\n"
				<< "int64: " << li << "\n"
				<< "bool: " << b << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}